

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test::TestBody
          (CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *this)

{
  bool bVar1;
  int iVar2;
  GMM_RESOURCE_INFO *pGVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  uint64_t uVar16;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  uint uStack_150;
  uint uStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  ulong local_110;
  uint64_t SliceTileOffset;
  ulong local_100;
  uint local_f8;
  uint local_f4;
  uint32_t SliceY;
  uint32_t Mip1RenderAlignedOffset;
  uint32_t Mip2RenderAlignedOffset;
  uint32_t Mip3RenderAlignedOffset;
  uint32_t Mip4RenderAlignedOffset;
  undefined4 local_d8;
  uint uStack_d4;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  unsigned_long uStack_a8;
  uint local_a0 [10];
  ulong local_78;
  uint local_6c;
  GMM_RESOURCE_INFO *local_68;
  ulong local_60;
  byte local_51;
  AssertHelper local_50;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  uStack_120 = 0;
  local_168 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_118 = 0;
  local_190 = 0x14500000002;
  local_128 = 0x100000000;
  local_180 = 0x400000000;
  local_188 = 0x20000000;
  uStack_150 = 0;
  uStack_14c = 6;
  uStack_160 = 4;
  local_158 = 4;
  pGVar3 = (GMM_RESOURCE_INFO *)
           (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                     (CommonULT::pGmmULTClientContext,&local_190);
  CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar3,8);
  local_68 = pGVar3;
  CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar3,8);
  pGVar3 = local_68;
  uVar15 = (int)uStack_160 + 7U & 0xfffffff8;
  local_6c = (int)local_158 + 7;
  uVar12 = local_6c & 0xfffffff8;
  if (uStack_150 == 0) {
    local_78 = 0;
    uVar13 = 0;
    uVar9 = 0;
    uVar10 = 0;
  }
  else {
    uVar8 = 2;
    if (2 < uStack_150 + 1) {
      uVar8 = uStack_150 + 1;
    }
    uVar5 = 1;
    uVar4 = 0;
    uVar13 = 0;
    local_78 = 0;
    uVar7 = 0;
    do {
      uVar9 = uVar15 >> ((byte)uVar5 & 0x1f);
      uVar10 = uVar9 + 7 + (uint)(uVar9 == 0) & 0xfffffff8;
      uVar9 = uVar12 >> ((byte)uVar5 & 0x1f);
      uVar9 = uVar9 + 7 + (uint)(uVar9 == 0) & 0xfffffff8;
      if (uVar5 == 1) {
        uVar4 = (ulong)uVar10;
        local_78 = uVar4;
      }
      else if (uVar5 == 2) {
        uVar4 = (ulong)((int)uVar4 + uVar10);
        uVar13 = uVar9;
        uVar9 = uVar7;
      }
      else {
        uVar13 = uVar13 + uVar9;
        uVar9 = uVar7;
      }
      uVar10 = (uint)uVar4;
      uVar5 = uVar5 + 1;
      uVar7 = uVar9;
    } while (uVar8 != uVar5);
  }
  if (uVar13 < uVar9) {
    uVar13 = uVar9;
  }
  _Mip4RenderAlignedOffset = (ulong)(uVar13 + uVar12);
  if (uVar15 < uVar10) {
    uVar15 = uVar10;
  }
  uVar13 = uVar15 + 0x3f & 0xffffffc0;
  CTestResource::VerifyResourcePitch<true>((CTestResource *)this,local_68,uVar13 * 2);
  CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,uVar15 + 0x3f >> 6);
  Mip3RenderAlignedOffset = uVar13 * Mip4RenderAlignedOffset;
  local_60 = (ulong)uVar13;
  CTestResource::VerifyResourceSize<true>
            ((CTestResource *)this,pGVar3,
             (ulong)(uStack_14c * Mip3RenderAlignedOffset + 0xfff & 0xfffff000));
  uVar16 = _Mip4RenderAlignedOffset;
  CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar3,_Mip4RenderAlignedOffset);
  if ((uStack_14c != 0) && (3 < uStack_150)) {
    iVar6 = (int)local_60;
    local_100 = (ulong)(iVar6 * uVar12);
    iVar2 = ((uVar12 >> 2) + 7 & 0xfffffff8) + uVar12;
    SliceTileOffset = (uint64_t)(uint)(iVar6 * iVar2 + (int)local_78);
    local_6c = (((local_6c >> 3) + 7 & 0xfffffff8) + iVar2) * iVar6 + (int)local_78;
    bVar14 = 1;
    uVar15 = 0;
    do {
      local_a0[4] = 0;
      local_a0[5] = 0;
      local_a0[6] = 0;
      local_a0[7] = 0;
      local_a0[0] = 0;
      local_a0[1] = 0;
      local_a0[2] = 0;
      local_a0[3] = 0;
      local_b0 = 0;
      uStack_a8 = 0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      uStack_d0 = 0;
      uStack_c8 = 0;
      local_a0[8] = 0;
      local_a0[9] = 0;
      _local_d8 = CONCAT44(uVar15,1);
      (**(code **)(*(long *)local_68 + 0x68))(local_68,&local_d8);
      local_f8 = uVar15 * (int)uVar16;
      local_110 = (ulong)((local_f8 & 0xffffffc0) << 6);
      local_f8 = local_f8 & 0x3f;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_48,"SliceTileOffset","ReqInfo.Render.Offset64",&local_110,&uStack_a8);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x664,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,local_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x665,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"SliceY","ReqInfo.Render.YOffset",&local_f8,local_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x666,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      local_51 = bVar14;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar2 = uVar15 * Mip3RenderAlignedOffset;
      uStack_c8 = 0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      local_b0 = 0;
      uStack_a8 = 0;
      local_a0[0] = 0;
      local_a0[1] = 0;
      local_a0[2] = 0;
      local_a0[3] = 0;
      local_a0[4] = 0;
      local_a0[5] = 0;
      local_a0[6] = 0;
      local_a0[7] = 0;
      local_a0[8] = 0;
      local_a0[9] = 0;
      uStack_d0 = 1;
      _local_d8 = CONCAT44(uVar15,1);
      (**(code **)(*(long *)local_68 + 0x68))(local_68,&local_d8);
      uVar12 = (int)local_100 + iVar2;
      uVar13 = uVar12 / (uint)local_60;
      uVar12 = uVar12 % (uint)local_60;
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,local_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x671,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = uVar13 & 0x3f;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"Mip1Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&gtest_ar.message_,
                 local_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x672,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_f4 = uVar12 * 0x40 + (uVar13 & 0xffffffc0) * (uint)local_60;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"Mip1RenderAlignedOffset","ReqInfo.Render.Offset64",&local_f4,&uStack_a8);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x676,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uStack_c8 = 0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      local_b0 = 0;
      uStack_a8 = 0;
      local_a0[0] = 0;
      local_a0[1] = 0;
      local_a0[2] = 0;
      local_a0[3] = 0;
      local_a0[4] = 0;
      local_a0[5] = 0;
      local_a0[6] = 0;
      local_a0[7] = 0;
      local_a0[8] = 0;
      local_a0[9] = 0;
      uStack_d0 = 2;
      _local_d8 = CONCAT44(uVar15,1);
      (**(code **)(*(long *)local_68 + 0x68))(local_68,&local_d8);
      uVar12 = (int)local_78 + iVar2 + (int)local_100;
      uVar13 = uVar12 / (uint)local_60;
      uVar12 = uVar12 % (uint)local_60;
      gtest_ar.message_.ptr_._0_4_ = 8;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"8","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,local_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x682,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = uVar13 & 0x3f;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"Mip2Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&gtest_ar.message_,
                 local_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x683,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      SliceY = (uVar12 & 0xffffffc0) * 0x40 + (uVar13 & 0xffffffc0) * (uint)local_60;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"Mip2RenderAlignedOffset","ReqInfo.Render.Offset64",&SliceY,&uStack_a8);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x687,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uStack_c8 = 0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      local_b0 = 0;
      uStack_a8 = 0;
      local_a0[0] = 0;
      local_a0[1] = 0;
      local_a0[2] = 0;
      local_a0[3] = 0;
      local_a0[4] = 0;
      local_a0[5] = 0;
      local_a0[6] = 0;
      local_a0[7] = 0;
      local_a0[8] = 0;
      local_a0[9] = 0;
      uStack_d0 = 3;
      _local_d8 = CONCAT44(uVar15,1);
      (**(code **)(*(long *)local_68 + 0x68))(local_68,&local_d8);
      uVar12 = (int)SliceTileOffset + iVar2;
      uVar13 = uVar12 / (uint)local_60;
      uVar12 = uVar12 % (uint)local_60;
      gtest_ar.message_.ptr_._0_4_ = 8;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"8","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,local_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x693,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = uVar13 & 0x3f;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"Mip3Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&gtest_ar.message_,
                 local_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x694,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      Mip1RenderAlignedOffset =
           (uVar12 & 0xffffffc0) * 0x40 + (uVar13 & 0xffffffc0) * (uint)local_60;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"Mip3RenderAlignedOffset","ReqInfo.Render.Offset64",
                 &Mip1RenderAlignedOffset,&uStack_a8);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x698,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uStack_c8 = 0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      local_b0 = 0;
      uStack_a8 = 0;
      local_a0[0] = 0;
      local_a0[1] = 0;
      local_a0[2] = 0;
      local_a0[3] = 0;
      local_a0[4] = 0;
      local_a0[5] = 0;
      local_a0[6] = 0;
      local_a0[7] = 0;
      local_a0[8] = 0;
      local_a0[9] = 0;
      uStack_d0 = 4;
      _local_d8 = CONCAT44(uVar15,1);
      (**(code **)(*(long *)local_68 + 0x68))(local_68,&local_d8);
      uVar15 = (iVar2 + local_6c) / (uint)local_60;
      uVar12 = (iVar2 + local_6c) % (uint)local_60;
      gtest_ar.message_.ptr_._0_4_ = 8;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"8","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,local_a0);
      uVar16 = _Mip4RenderAlignedOffset;
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x6a4,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = uVar15 & 0x3f;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"Mip4Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&gtest_ar.message_,
                 local_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x6a5,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      Mip2RenderAlignedOffset =
           (uVar12 & 0xffffffc0) * 0x40 + (uVar15 & 0xffffffc0) * (uint)local_60;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"Mip4RenderAlignedOffset","ReqInfo.Render.Offset64",
                 &Mip2RenderAlignedOffset,&uStack_a8);
      bVar14 = local_51;
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x6a9,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar15 = (uint)bVar14;
    } while ((uVar15 < uStack_14c) && (bVar14 = bVar14 + 1, 3 < uStack_150));
  }
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,local_68);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test2DStencilArrayedCpuBltResource)
{
    const uint32_t HAlign = {8};
    const uint32_t VAlign = {8};

    const uint32_t TileSize[2] = {64, 64}; //TileW

    GMM_RESCREATE_PARAMS gmmParams      = {};
    gmmParams.Type                      = RESOURCE_2D;
    gmmParams.NoGfxMemory               = 1;
    gmmParams.Flags.Info.TiledW         = 1;
    gmmParams.Flags.Gpu.SeparateStencil = 1;
    gmmParams.MaxLod                    = 0;
    gmmParams.ArraySize                 = 6;

    {
        uint32_t AlignedWidth  = 0;
        uint32_t AlignedHeight = 0;
        uint32_t ExpectedPitch = 0;
        // Valigned Mip Heights
        uint32_t Mip0Height = 0;
        uint32_t Mip1Height = 0;
        uint32_t Mip2Height = 0;

        // Haligned Mip Widths
        uint32_t Mip0Width = 0;
        uint32_t Mip1Width = 0;
        uint32_t Mip2Width = 0;

        TEST_BPP bpp          = TEST_BPP_8;
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x4;
        gmmParams.BaseHeight  = 0x4;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);

        // Mip resource Aligned Width calculation
        Mip0Width  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        Mip0Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);

        for(uint32_t i = 1; i <= gmmParams.MaxLod; i++)
        {
            uint32_t MipWidth  = GMM_ULT_ALIGN(GMM_ULT_MAX(Mip0Width >> i, 1), HAlign);
            uint32_t MipHeight = GMM_ULT_ALIGN(GMM_ULT_MAX(Mip0Height >> i, 1), VAlign);
            if(i == 1)
            {
                Mip1Width = AlignedWidth = MipWidth;
                Mip1Height               = MipHeight;
            }
            else if(i == 2)
            {
                AlignedWidth += MipWidth;
                Mip2Height = MipHeight;
            }
            else
            {
                Mip2Height += MipHeight;
            }
        }

        uint32_t MaxHeight = GMM_ULT_MAX(Mip1Height, Mip2Height);
        AlignedHeight      = Mip0Height + MaxHeight;

        ExpectedPitch = GMM_ULT_MAX(AlignedWidth, Mip0Width) * GetBppValue(bpp);
        ExpectedPitch = GMM_ULT_ALIGN(ExpectedPitch, TileSize[0]);
        //TileW is programmed as row-interleaved.. ie doubled pitch
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch * 2);

        VerifyResourcePitchInTiles<true>(ResourceInfo, static_cast<uint32_t>(ExpectedPitch / TileSize[0]));
        VerifyResourceSize<true>(ResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * AlignedHeight * gmmParams.ArraySize, PAGE_SIZE));
        VerifyResourceQPitch<true>(ResourceInfo, AlignedHeight);

        for(uint8_t i = 0; i < gmmParams.ArraySize && gmmParams.MaxLod >= 4; i++)
        {
            uint64_t ArrayOffset = AlignedHeight * ExpectedPitch * i;

            // Mip 0 offsets, offset is 0,0
            GMM_REQ_OFFSET_INFO ReqInfo = {0};
            ReqInfo.MipLevel            = 0;
            ReqInfo.ReqRender           = 1;
            ReqInfo.ArrayIndex          = i;
            ResourceInfo->GetOffset(ReqInfo);

            uint32_t Mip0Size        = ExpectedPitch * Mip0Height;
            uint64_t SliceTileOffset = GFX_ALIGN_FLOOR(AlignedHeight * i, TileSize[1]) * TileSize[0];
            uint32_t SliceY          = (AlignedHeight * i) % TileSize[1];
            EXPECT_EQ(SliceTileOffset, ReqInfo.Render.Offset64);
            EXPECT_EQ(0, ReqInfo.Render.XOffset);
            EXPECT_EQ(SliceY, ReqInfo.Render.YOffset);

            // Mip 1 offsets
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 1;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip1Offset = Mip0Size + ArrayOffset;
            uint32_t Mip1X      = uint32_t(Mip1Offset % ExpectedPitch);
            uint32_t Mip1Y      = uint32_t(Mip1Offset / ExpectedPitch);
            EXPECT_EQ(0, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip1Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip1X                            = GFX_ALIGN_FLOOR(Mip1X, TileSize[0]);
            Mip1Y                            = GFX_ALIGN_FLOOR(Mip1Y, TileSize[1]);
            uint32_t Mip1RenderAlignedOffset = Mip1Y * ExpectedPitch + (Mip1X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip1RenderAlignedOffset, ReqInfo.Render.Offset64);


            // Mip 2 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 2;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip2Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch + ArrayOffset;
            uint32_t Mip2X      = uint32_t(Mip2Offset % ExpectedPitch);
            uint32_t Mip2Y      = uint32_t(Mip2Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip2Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip2X                            = GFX_ALIGN_FLOOR(Mip2X, TileSize[0]);
            Mip2Y                            = GFX_ALIGN_FLOOR(Mip2Y, TileSize[1]);
            uint32_t Mip2RenderAlignedOffset = Mip2Y * ExpectedPitch + (Mip2X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip2RenderAlignedOffset, ReqInfo.Render.Offset64);

            // Mip 3 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 3;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);

            uint32_t Mip3Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + GMM_ULT_ALIGN(Mip0Height >> 2, VAlign)) * ExpectedPitch + ArrayOffset;
            uint32_t Mip3X      = uint32_t(Mip3Offset % ExpectedPitch);
            uint32_t Mip3Y      = uint32_t(Mip3Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip3Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip3X                            = GFX_ALIGN_FLOOR(Mip3X, TileSize[0]);
            Mip3Y                            = GFX_ALIGN_FLOOR(Mip3Y, TileSize[1]);
            uint32_t Mip3RenderAlignedOffset = Mip3Y * ExpectedPitch + (Mip3X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip3RenderAlignedOffset, ReqInfo.Render.Offset64);

            // Mip 4 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 4;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip4Offset = 0;
            Mip4Offset          = Mip1Width * GetBppValue(bpp) + (Mip0Height + GMM_ULT_ALIGN(Mip0Height >> 2, VAlign) + GMM_ULT_ALIGN(Mip0Height >> 3, VAlign)) * ExpectedPitch + ArrayOffset;
            uint32_t Mip4X      = uint32_t(Mip4Offset % ExpectedPitch);
            uint32_t Mip4Y      = uint32_t(Mip4Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip4Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip4X                            = GFX_ALIGN_FLOOR(Mip4X, TileSize[0]);
            Mip4Y                            = GFX_ALIGN_FLOOR(Mip4Y, TileSize[1]);
            uint32_t Mip4RenderAlignedOffset = Mip4Y * ExpectedPitch + (Mip4X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip4RenderAlignedOffset, ReqInfo.Render.Offset64);
        }

        //Verify CpuBlt path (uses Render offset for upload)
        {
#ifdef _WIN32
#define ULT_ALIGNED_MALLOC(Size, alignBytes) _aligned_malloc(Size, alignBytes)
#define ULT_ALIGNED_FREE(ptr) _aligned_free(ptr)
#else
#define ULT_ALIGNED_MALLOC(Size, alignBytes) memalign(alignBytes, Size)
#define ULT_ALIGNED_FREE(ptr) free(ptr)
#endif

#ifdef _WIN32
            void *LockVA = ULT_ALIGNED_MALLOC(ResourceInfo->GetSizeSurface(), ResourceInfo->GetBaseAlignment());
            memset(LockVA, 0, ResourceInfo->GetSizeSurface());
            void *Sysmem = malloc(gmmParams.BaseWidth64 * gmmParams.BaseHeight);
            memset(Sysmem, 0xbb, gmmParams.BaseWidth64 * gmmParams.BaseHeight);
            //Test Upload
            GMM_RES_COPY_BLT Blt  = {0};
            Blt.Gpu.pData         = LockVA;
            Blt.Gpu.Slice         = 4;
            Blt.Gpu.MipLevel      = 0;
            Blt.Sys.BufferSize    = gmmParams.BaseWidth64 * gmmParams.BaseHeight;
            Blt.Sys.pData         = Sysmem;
            Blt.Sys.RowPitch      = gmmParams.BaseWidth64;
            Blt.Sys.PixelPitch    = 1;
            Blt.Sys.SlicePitch    = Blt.Sys.BufferSize;
            Blt.Blt.Upload        = 1;
            Blt.Blt.BytesPerPixel = 1;
            ResourceInfo->CpuBlt(&Blt);

            uint64_t Offset = 0x100; /*Blt.Gpu.Slice * ResourceInfo->GetQPitchInBytes();*/ // Need SwizzledOffset
            for(uint8_t byte = 0; byte < Blt.Sys.BufferSize; byte++)
            {
                uint8_t *Byte = ((uint8_t *)LockVA) + Offset + byte;
                EXPECT_EQ(Byte[0], 0xbb);
            }

            free(Sysmem);
            ULT_ALIGNED_FREE(LockVA);
#endif
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}